

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 HashmapNodeCmp(jx9_hashmap_node *pLeft,jx9_hashmap_node *pRight,int bStrict)

{
  sxi32 sVar1;
  int in_ECX;
  jx9_value sObj2;
  jx9_value sObj1;
  jx9_value jStack_a8;
  jx9_value local_68;
  
  if (pLeft == pRight) {
    sVar1 = 0;
  }
  else {
    jx9MemObjInit(pLeft->pMap->pVm,&local_68);
    jx9MemObjInit(pLeft->pMap->pVm,&jStack_a8);
    jx9HashmapExtractNodeValue(pLeft,&local_68,0);
    jx9HashmapExtractNodeValue(pRight,&jStack_a8,0);
    sVar1 = jx9MemObjCmp(&local_68,&jStack_a8,bStrict,in_ECX);
    jx9MemObjRelease(&local_68);
    jx9MemObjRelease(&jStack_a8);
  }
  return sVar1;
}

Assistant:

static sxi32 HashmapNodeCmp(jx9_hashmap_node *pLeft, jx9_hashmap_node *pRight, int bStrict)
{
	jx9_value sObj1, sObj2;
	sxi32 rc;
	if( pLeft == pRight ){
		/*
		 * Same node.Refer to the sort() implementation defined
		 * below for more information on this sceanario.
		 */
		return 0;
	}
	/* Do the comparison */
	jx9MemObjInit(pLeft->pMap->pVm, &sObj1);
	jx9MemObjInit(pLeft->pMap->pVm, &sObj2);
	jx9HashmapExtractNodeValue(pLeft, &sObj1, FALSE);
	jx9HashmapExtractNodeValue(pRight, &sObj2, FALSE);
	rc = jx9MemObjCmp(&sObj1, &sObj2, bStrict, 0);
	jx9MemObjRelease(&sObj1);
	jx9MemObjRelease(&sObj2);
	return rc;
}